

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O0

void __thiscall GrcErrorList::WriteTableVersionsGenerated(GrcErrorList *this,ostream *strmOut)

{
  ostream *poVar1;
  ostream *in_RSI;
  int in_stack_0000001c;
  int fxd;
  string local_38 [36];
  TableId in_stack_ffffffffffffffec;
  
  std::operator<<(in_RSI,"Table versions generated:\n");
  WriteTableDescriptionString(in_RSI,in_stack_ffffffffffffffec);
  WriteTableDescriptionString(in_RSI,in_stack_ffffffffffffffec);
  WriteTableDescriptionString(in_RSI,in_stack_ffffffffffffffec);
  WriteTableDescriptionString(in_RSI,in_stack_ffffffffffffffec);
  WriteTableDescriptionString(in_RSI,in_stack_ffffffffffffffec);
  GrcManager::CompilerVersion(&g_cman);
  poVar1 = std::operator<<(in_RSI,"Minimal compiler version required: ");
  VersionString_abi_cxx11_(in_stack_0000001c);
  poVar1 = std::operator<<(poVar1,local_38);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_38);
  std::operator<<(in_RSI,"\n*******************************************************\n\n");
  return;
}

Assistant:

void GrcErrorList::WriteTableVersionsGenerated(std::ostream& strmOut)
{
	strmOut << "Table versions generated:\n";

	WriteTableDescriptionString(strmOut, ktiSilf);
	WriteTableDescriptionString(strmOut, ktiGloc);
	WriteTableDescriptionString(strmOut, ktiGlat);
	WriteTableDescriptionString(strmOut, ktiFeat);
	WriteTableDescriptionString(strmOut, ktiSill);

	const int fxd = g_cman.CompilerVersion();
	strmOut << "Minimal compiler version required: " << VersionString(fxd) << "\n";

	strmOut << "\n*******************************************************\n\n";
}